

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

void soul::StructuralParser::recursivelyReplaceParentScope(Expression *target,Scope *newScope)

{
  ScopeReplacingVisitor v;
  ASTVisitor local_28;
  Scope *local_20;
  Scope *local_18;
  
  local_28._vptr_ASTVisitor = (_func_int **)&PTR__ASTVisitor_002f7840;
  local_20 = (target->super_Statement).super_ASTObject.context.parentScope;
  local_18 = newScope;
  ASTVisitor::visitObject(&local_28,target);
  if ((target->super_Statement).super_ASTObject.context.parentScope == local_20) {
    (target->super_Statement).super_ASTObject.context.parentScope = local_18;
  }
  return;
}

Assistant:

static void recursivelyReplaceParentScope (AST::Expression& target, AST::Scope& newScope)
    {
        struct ScopeReplacingVisitor  : public ASTVisitor
        {
            void visitObject (AST::Expression& e) override
            {
                ASTVisitor::visitObject (e);

                if (e.context.parentScope == oldScope)
                    e.context.parentScope = newScope;
            }

            AST::Scope* oldScope;
            AST::Scope* newScope;
        };

        ScopeReplacingVisitor v;
        v.oldScope = target.context.parentScope;
        v.newScope = std::addressof (newScope);
        v.visitObject (target);
    }